

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O3

void __thiscall
vkt::sr::ShaderRenderCaseInstance::createSamplerUniform
          (ShaderRenderCaseInstance *this,deUint32 bindingLocation,Type textureType,Init textureInit
          ,TextureFormat *texFormat,UVec3 *texSize,TextureData *textureData,Sampler *refSampler,
          deUint32 mipLevels,deUint32 arrayLayers,Parameters textureParams)

{
  long *plVar1;
  deInt32 *pdVar2;
  Allocator *pAVar3;
  UVec3 texSize_00;
  VkDevice device;
  Handle<(vk::HandleType)13> HVar4;
  Handle<(vk::HandleType)13> HVar5;
  Handle<(vk::HandleType)20> HVar6;
  undefined8 image;
  undefined8 uVar7;
  undefined8 uVar8;
  VkDevice pVVar9;
  VkImage VVar10;
  VkFormat VVar11;
  VkResult result;
  DeviceDriver *vk;
  UniformInfo *pUVar12;
  _func_int **pp_Var13;
  long *plVar14;
  long *plVar15;
  UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  *pUVar16;
  VkImageType imageType;
  int *piVar17;
  uint uVar18;
  uint uVar19;
  SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
  local_1b8;
  TextureFormat *local_1a8;
  deUint32 local_19c;
  VkImageViewType local_198;
  VkImageAspectFlags local_194;
  Init local_190;
  deUint32 queueFamilyIndex;
  VkDevice local_188;
  UVec3 *local_180;
  Move<vk::Handle<(vk::HandleType)13>_> local_178;
  Move<vk::Handle<(vk::HandleType)20>_> local_158;
  undefined1 local_138 [16];
  VkDevice local_128;
  VkImage VStack_120;
  VkImageViewType local_118;
  VkFormat local_114;
  VkComponentMapping local_110;
  VkImageAspectFlags local_100;
  deUint32 local_fc;
  deUint32 local_f8;
  deUint32 local_f4;
  deUint32 local_f0;
  VkSamplerCreateInfo samplerParams;
  undefined8 local_98;
  uint local_90;
  VkImageCreateInfo local_88;
  
  local_19c = bindingLocation;
  local_190 = textureInit;
  local_180 = texSize;
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    local_188 = (((this->m_sparseContext).
                  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                  .m_data.ptr)->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
LAB_0062dbe5:
    vk = &((this->m_sparseContext).
           super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
           .m_data.ptr)->m_deviceInterface;
  }
  else {
    local_188 = Context::getDevice((this->super_TestInstance).m_context);
    if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) goto LAB_0062dbe5;
    vk = (DeviceDriver *)Context::getDeviceInterface((this->super_TestInstance).m_context);
    if (this->m_imageBackingMode != IMAGE_BACKING_MODE_SPARSE) {
      queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context)
      ;
      goto LAB_0062dbf9;
    }
  }
  queueFamilyIndex =
       ((this->m_sparseContext).
        super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
        .m_data.ptr)->m_queueFamilyIndex;
LAB_0062dbf9:
  local_194 = 2 - (refSampler->compare == COMPAREMODE_NONE);
  uVar19 = textureType - TYPE_2D;
  local_198 = VK_IMAGE_VIEW_TYPE_1D;
  imageType = VK_IMAGE_TYPE_1D;
  uVar18 = 0;
  if (uVar19 < 6) {
    local_198 = textureType - VK_IMAGE_VIEW_TYPE_2D;
    imageType = *(VkImageType *)(&DAT_00afa3e0 + (ulong)uVar19 * 4);
    uVar18 = *(uint *)(&DAT_00afa3f8 + (ulong)uVar19 * 4);
  }
  VVar11 = ::vk::mapTextureFormat(texFormat);
  local_1a8 = texFormat;
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    checkSparseSupport(this,imageType);
    uVar18 = uVar18 | 3;
  }
  device = local_188;
  local_88.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_88.pNext = (void *)0x0;
  local_88.extent.width = local_180->m_data[0];
  local_88.extent.height = local_180->m_data[1];
  local_88.extent.depth = local_180->m_data[2];
  local_88.mipLevels = mipLevels;
  local_88.arrayLayers = arrayLayers;
  local_88.samples = textureParams.samples;
  local_88.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_88.usage = 6;
  local_88.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_88.queueFamilyIndexCount = 1;
  local_88.pQueueFamilyIndices = &queueFamilyIndex;
  local_88.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_88.flags = uVar18;
  local_88.imageType = imageType;
  local_88.format = VVar11;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)local_138,&vk->super_DeviceInterface,
                    local_188,&local_88,(VkAllocationCallbacks *)0x0);
  VVar10.m_internal = VStack_120.m_internal;
  pVVar9 = local_128;
  uVar8 = local_138._8_8_;
  image = local_138._0_8_;
  VStack_120.m_internal = 0;
  local_128 = (VkDevice)0x0;
  local_138._8_8_ = (DeviceInterface *)0x0;
  local_138._0_8_ = 0;
  pAVar3 = this->m_memAlloc;
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)&samplerParams,&vk->super_DeviceInterface,device,(VkImage)image
            );
  uVar19 = 0x62dde7;
  (*pAVar3->_vptr_Allocator[3])(local_138,pAVar3,&samplerParams,0);
  uVar7 = local_138._0_8_;
  if (this->m_imageBackingMode != IMAGE_BACKING_MODE_SPARSE) {
    result = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0xd])
                       (vk,device,image,*(undefined8 *)(local_138._0_8_ + 8));
    uVar19 = 0x62de2d;
    ::vk::checkResult(result,
                      "vk.bindImageMemory(vkDevice, *vkTexture, allocation->getMemory(), allocation->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                      ,0x818);
  }
  if (local_190 == INIT_CLEAR) {
    clearImage(this,refSampler,mipLevels,arrayLayers,(VkImage)image);
  }
  else if (local_190 == INIT_UPLOAD_DATA) {
    if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
      local_90 = local_180->m_data[2];
      local_98 = *(undefined8 *)local_180->m_data;
      texSize_00.m_data[2] = uVar19;
      texSize_00.m_data._0_8_ = &local_98;
      uploadSparseImage(this,local_1a8,textureData,refSampler,mipLevels,arrayLayers,(VkImage)image,
                        &local_88,texSize_00);
    }
    else {
      uploadImage(this,local_1a8,textureData,refSampler,mipLevels,arrayLayers,(VkImage)image);
    }
  }
  ::vk::mapSampler(&samplerParams,refSampler,local_1a8,0.0,1000.0);
  ::vk::createSampler(&local_158,&vk->super_DeviceInterface,device,&samplerParams,
                      (VkAllocationCallbacks *)0x0);
  local_110.r = textureParams.componentMapping.r;
  local_110.g = textureParams.componentMapping.g;
  local_110.b = textureParams.componentMapping.b;
  local_110.a = textureParams.componentMapping.a;
  local_138._0_4_ = 0xf;
  local_138._8_8_ = (DeviceInterface *)0x0;
  local_128 = (VkDevice)((ulong)local_128 & 0xffffffff00000000);
  VStack_120.m_internal = image;
  local_118 = local_198;
  local_100 = local_194;
  local_fc = textureParams.baseMipLevel;
  local_f8 = mipLevels - textureParams.baseMipLevel;
  local_f4 = 0;
  local_f0 = arrayLayers;
  local_114 = VVar11;
  ::vk::createImageView
            (&local_178,&vk->super_DeviceInterface,device,(VkImageViewCreateInfo *)local_138,
             (VkAllocationCallbacks *)0x0);
  HVar6.m_internal =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal;
  HVar4.m_internal =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  pUVar12 = (UniformInfo *)operator_new(0x68);
  HVar5.m_internal =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  pUVar12->_vptr_UniformInfo = (_func_int **)&PTR__SamplerUniform_00cf8650;
  pUVar12[1]._vptr_UniformInfo = (_func_int **)0x0;
  pUVar12[1].type = VK_DESCRIPTOR_TYPE_SAMPLER;
  pUVar12[1].location = 0;
  pUVar12[2]._vptr_UniformInfo = (_func_int **)0x0;
  pUVar12[2].type = VK_DESCRIPTOR_TYPE_SAMPLER;
  pUVar12[2].location = 0;
  pUVar12[3]._vptr_UniformInfo = (_func_int **)0x0;
  pUVar12[3].type = VK_DESCRIPTOR_TYPE_SAMPLER;
  pUVar12[3].location = 0;
  pUVar12[4]._vptr_UniformInfo = (_func_int **)0x0;
  pUVar12[4].type = VK_DESCRIPTOR_TYPE_SAMPLER;
  pUVar12[4].location = 0;
  pUVar12->type = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  pUVar12[5]._vptr_UniformInfo = (_func_int **)HVar6.m_internal;
  local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._0_4_ =
       (undefined4)HVar4.m_internal;
  local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_ =
       SUB84(HVar4.m_internal,4);
  pUVar12[5].type =
       (undefined4)local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  pUVar12[5].location =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
  *(undefined4 *)&pUVar12[6]._vptr_UniformInfo = 5;
  pUVar12->location = local_19c;
  local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
       HVar5.m_internal;
  pp_Var13 = (_func_int **)operator_new(0x20);
  pp_Var13[2] = (_func_int *)pVVar9;
  pp_Var13[3] = (_func_int *)VVar10.m_internal;
  *pp_Var13 = (_func_int *)image;
  pp_Var13[1] = (_func_int *)uVar8;
  plVar14 = (long *)operator_new(0x20);
  *(undefined4 *)(plVar14 + 1) = 0;
  *(undefined4 *)((long)plVar14 + 0xc) = 0;
  *plVar14 = (long)&PTR__SharedPtrState_00cef170;
  plVar14[2] = (long)pp_Var13;
  *(undefined4 *)(plVar14 + 1) = 1;
  *(undefined4 *)((long)plVar14 + 0xc) = 1;
  pUVar12[1]._vptr_UniformInfo = pp_Var13;
  *(long **)&pUVar12[1].type = plVar14;
  LOCK();
  *(int *)(plVar14 + 1) = (int)plVar14[1] + 1;
  UNLOCK();
  LOCK();
  piVar17 = (int *)(*(long *)&pUVar12[1].type + 0xc);
  *piVar17 = *piVar17 + 1;
  UNLOCK();
  piVar17 = (int *)((long)plVar14 + 0xc);
  LOCK();
  plVar1 = plVar14 + 1;
  *(int *)plVar1 = (int)*plVar1 + -1;
  UNLOCK();
  if ((int)*plVar1 == 0) {
    (**(code **)(*plVar14 + 0x10))(plVar14);
  }
  LOCK();
  *piVar17 = *piVar17 + -1;
  UNLOCK();
  if (*piVar17 == 0) {
    (**(code **)(*plVar14 + 8))(plVar14);
  }
  pp_Var13 = (_func_int **)operator_new(0x20);
  pp_Var13[2] = (_func_int *)
                local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pp_Var13[3] = (_func_int *)
                local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  *pp_Var13 = (_func_int *)
              local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  pp_Var13[1] = (_func_int *)
                local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                m_deviceIface;
  local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  plVar15 = (long *)operator_new(0x20);
  plVar1 = plVar15 + 1;
  *(undefined4 *)(plVar15 + 1) = 0;
  *(undefined4 *)((long)plVar15 + 0xc) = 0;
  *plVar15 = (long)&PTR__SharedPtrState_00cef1b0;
  plVar15[2] = (long)pp_Var13;
  *(undefined4 *)(plVar15 + 1) = 1;
  *(undefined4 *)((long)plVar15 + 0xc) = 1;
  plVar14 = *(long **)&pUVar12[2].type;
  if (plVar14 != plVar15) {
    if (plVar14 != (long *)0x0) {
      LOCK();
      plVar14 = plVar14 + 1;
      *(int *)plVar14 = (int)*plVar14 + -1;
      UNLOCK();
      if ((int)*plVar14 == 0) {
        pUVar12[2]._vptr_UniformInfo = (_func_int **)0x0;
        (**(code **)(**(long **)&pUVar12[2].type + 0x10))();
      }
      LOCK();
      piVar17 = (int *)(*(long *)&pUVar12[2].type + 0xc);
      *piVar17 = *piVar17 + -1;
      UNLOCK();
      if (*piVar17 == 0) {
        if (*(long **)&pUVar12[2].type != (long *)0x0) {
          (**(code **)(**(long **)&pUVar12[2].type + 8))();
        }
        pUVar12[2].type = VK_DESCRIPTOR_TYPE_SAMPLER;
        pUVar12[2].location = 0;
      }
    }
    pUVar12[2]._vptr_UniformInfo = pp_Var13;
    *(long **)&pUVar12[2].type = plVar15;
    LOCK();
    *(int *)(plVar15 + 1) = (int)plVar15[1] + 1;
    UNLOCK();
    LOCK();
    piVar17 = (int *)(*(long *)&pUVar12[2].type + 0xc);
    *piVar17 = *piVar17 + 1;
    UNLOCK();
  }
  piVar17 = (int *)((long)plVar15 + 0xc);
  LOCK();
  *(int *)plVar1 = (int)*plVar1 + -1;
  UNLOCK();
  if ((int)*plVar1 == 0) {
    (**(code **)(*plVar15 + 0x10))(plVar15);
  }
  LOCK();
  *piVar17 = *piVar17 + -1;
  UNLOCK();
  if (*piVar17 == 0) {
    (**(code **)(*plVar15 + 8))(plVar15);
  }
  pp_Var13 = (_func_int **)operator_new(0x20);
  pp_Var13[2] = (_func_int *)
                local_158.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device;
  pp_Var13[3] = (_func_int *)
                local_158.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator;
  *pp_Var13 = (_func_int *)
              local_158.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal;
  pp_Var13[1] = (_func_int *)
                local_158.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.
                m_deviceIface;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal = 0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  plVar15 = (long *)operator_new(0x20);
  plVar1 = plVar15 + 1;
  *(undefined4 *)(plVar15 + 1) = 0;
  *(undefined4 *)((long)plVar15 + 0xc) = 0;
  *plVar15 = (long)&PTR__SharedPtrState_00cef470;
  plVar15[2] = (long)pp_Var13;
  *(undefined4 *)(plVar15 + 1) = 1;
  *(undefined4 *)((long)plVar15 + 0xc) = 1;
  plVar14 = *(long **)&pUVar12[3].type;
  if (plVar14 != plVar15) {
    if (plVar14 != (long *)0x0) {
      LOCK();
      plVar14 = plVar14 + 1;
      *(int *)plVar14 = (int)*plVar14 + -1;
      UNLOCK();
      if ((int)*plVar14 == 0) {
        pUVar12[3]._vptr_UniformInfo = (_func_int **)0x0;
        (**(code **)(**(long **)&pUVar12[3].type + 0x10))();
      }
      LOCK();
      piVar17 = (int *)(*(long *)&pUVar12[3].type + 0xc);
      *piVar17 = *piVar17 + -1;
      UNLOCK();
      if (*piVar17 == 0) {
        if (*(long **)&pUVar12[3].type != (long *)0x0) {
          (**(code **)(**(long **)&pUVar12[3].type + 8))();
        }
        pUVar12[3].type = VK_DESCRIPTOR_TYPE_SAMPLER;
        pUVar12[3].location = 0;
      }
    }
    pUVar12[3]._vptr_UniformInfo = pp_Var13;
    *(long **)&pUVar12[3].type = plVar15;
    LOCK();
    *(int *)(plVar15 + 1) = (int)plVar15[1] + 1;
    UNLOCK();
    LOCK();
    piVar17 = (int *)(*(long *)&pUVar12[3].type + 0xc);
    *piVar17 = *piVar17 + 1;
    UNLOCK();
  }
  piVar17 = (int *)((long)plVar15 + 0xc);
  LOCK();
  *(int *)plVar1 = (int)*plVar1 + -1;
  UNLOCK();
  if ((int)*plVar1 == 0) {
    (**(code **)(*plVar15 + 0x10))(plVar15);
  }
  LOCK();
  *piVar17 = *piVar17 + -1;
  UNLOCK();
  if (*piVar17 == 0) {
    (**(code **)(*plVar15 + 8))(plVar15);
  }
  plVar15 = (long *)operator_new(0x20);
  plVar1 = plVar15 + 1;
  *(undefined4 *)(plVar15 + 1) = 0;
  *(undefined4 *)((long)plVar15 + 0xc) = 0;
  *plVar15 = (long)&PTR__SharedPtrState_00cf0f58;
  plVar15[2] = uVar7;
  *(undefined4 *)(plVar15 + 1) = 1;
  *(undefined4 *)((long)plVar15 + 0xc) = 1;
  plVar14 = *(long **)&pUVar12[4].type;
  if (plVar14 != plVar15) {
    if (plVar14 != (long *)0x0) {
      LOCK();
      plVar14 = plVar14 + 1;
      *(int *)plVar14 = (int)*plVar14 + -1;
      UNLOCK();
      if ((int)*plVar14 == 0) {
        pUVar12[4]._vptr_UniformInfo = (_func_int **)0x0;
        (**(code **)(**(long **)&pUVar12[4].type + 0x10))();
      }
      LOCK();
      piVar17 = (int *)(*(long *)&pUVar12[4].type + 0xc);
      *piVar17 = *piVar17 + -1;
      UNLOCK();
      if (*piVar17 == 0) {
        if (*(long **)&pUVar12[4].type != (long *)0x0) {
          (**(code **)(**(long **)&pUVar12[4].type + 8))();
        }
        pUVar12[4].type = VK_DESCRIPTOR_TYPE_SAMPLER;
        pUVar12[4].location = 0;
      }
    }
    pUVar12[4]._vptr_UniformInfo = (_func_int **)uVar7;
    *(long **)&pUVar12[4].type = plVar15;
    LOCK();
    *(int *)(plVar15 + 1) = (int)plVar15[1] + 1;
    UNLOCK();
    LOCK();
    piVar17 = (int *)(*(long *)&pUVar12[4].type + 0xc);
    *piVar17 = *piVar17 + 1;
    UNLOCK();
  }
  piVar17 = (int *)((long)plVar15 + 0xc);
  LOCK();
  *(int *)plVar1 = (int)*plVar1 + -1;
  UNLOCK();
  if ((int)*plVar1 == 0) {
    (**(code **)(*plVar15 + 0x10))(plVar15);
  }
  LOCK();
  *piVar17 = *piVar17 + -1;
  UNLOCK();
  if (*piVar17 == 0) {
    (**(code **)(*plVar15 + 8))(plVar15);
  }
  ::vk::DescriptorSetLayoutBuilder::addBinding
            ((this->m_descriptorSetLayoutBuilder).
             super_UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
             .m_data.ptr,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1,0x7fffffff,(VkSampler *)0x0);
  ::vk::DescriptorPoolBuilder::addType
            ((this->m_descriptorPoolBuilder).
             super_UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>
             .m_data.ptr,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1);
  pUVar16 = (UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
             *)operator_new(0x10);
  (pUVar16->
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  ).m_data.ptr = pUVar12;
  local_1b8.m_state = (SharedPtrStateBase *)0x0;
  local_1b8.m_ptr = pUVar16;
  local_1b8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_1b8.m_state)->strongRefCount = 0;
  (local_1b8.m_state)->weakRefCount = 0;
  (local_1b8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cf8670;
  local_1b8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar16;
  (local_1b8.m_state)->strongRefCount = 1;
  (local_1b8.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>,std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>>>
  ::
  emplace_back<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>>
            ((vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>,std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>>>
              *)&this->m_uniformInfos,&local_1b8);
  if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar2 = &(local_1b8.m_state)->strongRefCount;
    *pdVar2 = *pdVar2 + -1;
    UNLOCK();
    if (*pdVar2 == 0) {
      local_1b8.m_ptr =
           (UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
            *)0x0;
      (*(local_1b8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar2 = &(local_1b8.m_state)->weakRefCount;
    *pdVar2 = *pdVar2 + -1;
    UNLOCK();
    if ((*pdVar2 == 0) && (local_1b8.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_1b8.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  if (local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkImageView)
               local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
  }
  if (local_158.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)20>_>::operator()
              (&local_158.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter,
               (VkSampler)
               local_158.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal);
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::createSamplerUniform (deUint32						bindingLocation,
													 TextureBinding::Type			textureType,
													 TextureBinding::Init			textureInit,
													 const tcu::TextureFormat&		texFormat,
													 const tcu::UVec3				texSize,
													 const TextureData&				textureData,
													 const tcu::Sampler&			refSampler,
													 deUint32						mipLevels,
													 deUint32						arrayLayers,
													 TextureBinding::Parameters		textureParams)
{
	const VkDevice					vkDevice			= getDevice();
	const DeviceInterface&			vk					= getDeviceInterface();
	const deUint32					queueFamilyIndex	= getUniversalQueueFamilyIndex();

	const bool						isShadowSampler		= refSampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	const VkImageAspectFlags		aspectMask			= isShadowSampler ? VK_IMAGE_ASPECT_DEPTH_BIT : VK_IMAGE_ASPECT_COLOR_BIT;
	const VkImageViewType			imageViewType		= textureTypeToImageViewType(textureType);
	const VkImageType				imageType			= viewTypeToImageType(imageViewType);
	const VkFormat					format				= mapTextureFormat(texFormat);
	const bool						isCube				= imageViewType == VK_IMAGE_VIEW_TYPE_CUBE || imageViewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY;
	VkImageCreateFlags				imageCreateFlags	= isCube ? (VkImageCreateFlags)VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT : (VkImageCreateFlags)0;
	VkImageUsageFlags				imageUsageFlags		= VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
	Move<VkImage>					vkTexture;
	de::MovePtr<Allocation>			allocation;

	if (m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE)
	{
		checkSparseSupport(imageType);
		imageCreateFlags |= VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT;
	}

	// Create image
	const VkImageCreateInfo			imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,							// VkStructureType			sType;
		DE_NULL,														// const void*				pNext;
		imageCreateFlags,												// VkImageCreateFlags		flags;
		imageType,														// VkImageType				imageType;
		format,															// VkFormat					format;
		{																// VkExtent3D				extent;
			texSize.x(),
			texSize.y(),
			texSize.z()
		},
		mipLevels,														// deUint32					mipLevels;
		arrayLayers,													// deUint32					arrayLayers;
		textureParams.samples,											// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,										// VkImageTiling			tiling;
		imageUsageFlags,												// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,										// VkSharingMode			sharingMode;
		1u,																// deUint32					queueFamilyIndexCount;
		&queueFamilyIndex,												// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED										// VkImageLayout			initialLayout;
	};

	vkTexture		= createImage(vk, vkDevice, &imageParams);
	allocation		= m_memAlloc.allocate(getImageMemoryRequirements(vk, vkDevice, *vkTexture), MemoryRequirement::Any);

	if (m_imageBackingMode != IMAGE_BACKING_MODE_SPARSE)
	{
		VK_CHECK(vk.bindImageMemory(vkDevice, *vkTexture, allocation->getMemory(), allocation->getOffset()));
	}

	switch (textureInit)
	{
		case TextureBinding::INIT_UPLOAD_DATA:
		{
			// upload*Image functions use cmdCopyBufferToImage, which is invalid for multisample images
			DE_ASSERT(textureParams.samples == VK_SAMPLE_COUNT_1_BIT);

			if (m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE)
			{
				uploadSparseImage(texFormat, textureData, refSampler, mipLevels, arrayLayers, *vkTexture, imageParams, texSize);
			}
			else
			{
				// Upload texture data
				uploadImage(texFormat, textureData, refSampler, mipLevels, arrayLayers, *vkTexture);
			}
			break;
		}
		case TextureBinding::INIT_CLEAR:
			clearImage(refSampler, mipLevels, arrayLayers, *vkTexture);
			break;
		default:
			DE_FATAL("Impossible");
	}

	// Create sampler
	const VkSamplerCreateInfo		samplerParams	= mapSampler(refSampler, texFormat);
	Move<VkSampler>					sampler			= createSampler(vk, vkDevice, &samplerParams);
	const deUint32					baseMipLevel	= textureParams.baseMipLevel;
	const vk::VkComponentMapping	components		= textureParams.componentMapping;
	const VkImageViewCreateInfo		viewParams		=
	{
		VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType			sType;
		NULL,										// const voide*				pNext;
		0u,											// VkImageViewCreateFlags	flags;
		*vkTexture,									// VkImage					image;
		imageViewType,								// VkImageViewType			viewType;
		format,										// VkFormat					format;
		components,									// VkChannelMapping			channels;
		{
			aspectMask,						// VkImageAspectFlags	aspectMask;
			baseMipLevel,					// deUint32				baseMipLevel;
			mipLevels - baseMipLevel,		// deUint32				mipLevels;
			0,								// deUint32				baseArraySlice;
			arrayLayers						// deUint32				arraySize;
		},											// VkImageSubresourceRange	subresourceRange;
	};

	Move<VkImageView>				imageView		= createImageView(vk, vkDevice, &viewParams);

	const vk::VkDescriptorImageInfo	descriptor		=
	{
		sampler.get(),								// VkSampler				sampler;
		imageView.get(),							// VkImageView				imageView;
		VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,	// VkImageLayout			imageLayout;
	};

	de::MovePtr<SamplerUniform> uniform(new SamplerUniform());
	uniform->type = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
	uniform->descriptor = descriptor;
	uniform->location = bindingLocation;
	uniform->image = VkImageSp(new vk::Unique<VkImage>(vkTexture));
	uniform->imageView = VkImageViewSp(new vk::Unique<VkImageView>(imageView));
	uniform->sampler = VkSamplerSp(new vk::Unique<VkSampler>(sampler));
	uniform->alloc = AllocationSp(allocation.release());

	m_descriptorSetLayoutBuilder->addSingleSamplerBinding(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, vk::VK_SHADER_STAGE_ALL, DE_NULL);
	m_descriptorPoolBuilder->addType(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER);

	m_uniformInfos.push_back(UniformInfoSp(new de::UniquePtr<UniformInfo>(uniform)));
}